

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

void nng_ctx_send(nng_ctx cid,nng_aio *aio)

{
  nng_err result;
  nni_msg *pnVar1;
  nni_ctx *local_20;
  nni_ctx *ctx;
  
  nni_aio_reset(aio);
  pnVar1 = nni_aio_get_msg(aio);
  if (pnVar1 != (nni_msg *)0x0) {
    result = nni_ctx_find(&local_20,cid.id);
    if (result == NNG_OK) {
      nni_ctx_send(local_20,aio);
      nni_ctx_rele(local_20);
    }
    else {
      nni_aio_finish_error(aio,result);
    }
    return;
  }
  nni_aio_finish_error(aio,NNG_EINVAL);
  return;
}

Assistant:

void
nng_ctx_send(nng_ctx cid, nng_aio *aio)
{
	int      rv;
	nni_ctx *ctx;

	nni_aio_reset(aio);
	if (nni_aio_get_msg(aio) == NULL) {
		nni_aio_finish_error(aio, NNG_EINVAL);
		return;
	}
	if ((rv = nni_ctx_find(&ctx, cid.id)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_ctx_send(ctx, aio);
	nni_ctx_rele(ctx);
}